

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O1

ostream * Logger::GetStream(LogSeverity severity)

{
  char cVar1;
  ostream *poVar2;
  
  if (severity == WARNING) {
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 != '\0') {
      return (ostream *)warn_log_file_;
    }
LAB_0013e1bc:
    poVar2 = (ostream *)&std::cerr;
  }
  else {
    if (severity == INFO) {
      cVar1 = std::__basic_file<char>::is_open();
      if (cVar1 != '\0') {
        return (ostream *)info_log_file_;
      }
    }
    else if ((severity & ~WARNING) == ERR) {
      cVar1 = std::__basic_file<char>::is_open();
      if (cVar1 != '\0') {
        return (ostream *)erro_log_file_;
      }
      goto LAB_0013e1bc;
    }
    poVar2 = (ostream *)&std::cout;
  }
  return poVar2;
}

Assistant:

std::ostream& Logger::GetStream(LogSeverity severity) {
  if (severity == INFO) {
    return info_log_file_.is_open() ? info_log_file_ : std::cout;
  } else if (severity == WARNING) {
    return warn_log_file_.is_open() ? warn_log_file_ : std::cerr;
  } else if (severity == ERR || severity == FATAL) {
    return erro_log_file_.is_open() ? erro_log_file_ : std::cerr;
  }
  return std::cout; // Print message
}